

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall Liby::TcpServer::initConnection(TcpServer *this,Connection *conn)

{
  Connection *this_00;
  anon_class_8_1_8991fb9c local_70;
  ConnCallback local_68;
  function<void_(Liby::Connection_&)> local_38;
  Connection *local_18;
  Connection *conn_local;
  TcpServer *this_local;
  
  local_18 = conn;
  conn_local = (Connection *)this;
  std::function<void_(Liby::Connection_&)>::function(&local_38,&this->readEventCallback_);
  this_00 = Connection::onRead(conn,&local_38);
  local_70.this = this;
  std::function<void(Liby::Connection&)>::
  function<Liby::TcpServer::initConnection(Liby::Connection&)::__0,void>
            ((function<void(Liby::Connection&)> *)&local_68,&local_70);
  Connection::onErro(this_00,&local_68);
  std::function<void_(Liby::Connection_&)>::~function(&local_68);
  std::function<void_(Liby::Connection_&)>::~function(&local_38);
  return;
}

Assistant:

void TcpServer::initConnection(Connection &conn) {
    conn.onRead(readEventCallback_).onErro([this](Connection &conn) {
        auto x = conn.shared_from_this();
        if (erroEventCallback_) {
            erroEventCallback_(conn);
        }
        x->destroy();
    });
}